

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O2

uint32_t helper_atomic_xchgl_be_m68k
                   (CPUArchState_conflict3 *env,target_ulong_conflict addr,uint32_t val,
                   TCGMemOpIdx oi)

{
  uint uVar1;
  uint *puVar2;
  uintptr_t unaff_retaddr;
  
  puVar2 = (uint *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  uVar1 = *puVar2;
  *puVar2 = val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

ABI_TYPE ATOMIC_NAME(xchg)(CPUArchState *env, target_ulong addr,
                           ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    ABI_TYPE ret;
    ret = *haddr;
    *haddr = BSWAP(val);
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}